

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

bool __thiscall llvm::StringRef::consume_front(StringRef *this,StringRef Prefix)

{
  ulong uVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  ulong __n;
  
  __n = Prefix.Length;
  uVar1 = this->Length;
  if (uVar1 < __n) {
LAB_00b016e9:
    bVar2 = false;
  }
  else {
    __s1 = this->Data;
    if (__n != 0) {
      iVar3 = bcmp(__s1,Prefix.Data,__n);
      if (iVar3 != 0) goto LAB_00b016e9;
    }
    this->Data = __s1 + __n;
    this->Length = uVar1 - __n;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool consume_front(StringRef Prefix) {
      if (!startswith(Prefix))
        return false;

      *this = drop_front(Prefix.size());
      return true;
    }